

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_struct_reader
          (t_c_glib_generator *this,ostream *out,t_struct *tstruct,string *this_name,
          string *this_get,bool is_function)

{
  int *piVar1;
  t_field *tfield;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  pointer pptVar4;
  char *this_00;
  undefined7 in_register_00000089;
  int local_24c;
  string local_248;
  string local_228;
  string local_208;
  t_struct *local_1e8;
  string local_1e0;
  string local_1c0;
  undefined4 local_19c;
  string local_198;
  string local_178;
  string local_158;
  string *local_138;
  string local_130;
  string name_u;
  string local_f0;
  string local_d0;
  string local_b0;
  string name_uc;
  string name;
  string local_50;
  
  local_19c = (undefined4)CONCAT71(in_register_00000089,is_function);
  local_1e8 = tstruct;
  local_138 = this_name;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string((string *)&name,(string *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::string((string *)&local_d0,(string *)&name);
  initial_caps_to_underscores(&name_u,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,(string *)&name_u);
  to_upper_case(&name_uc,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  local_24c = 0;
  if ((char)local_19c != '\0') {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"/* reads a ");
    poVar3 = std::operator<<(poVar3,(string *)&name_u);
    poVar3 = std::operator<<(poVar3," object */");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"static gint32");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&this->nspace_lc);
    poVar3 = std::operator<<(poVar3,(string *)&name_u);
    poVar3 = std::operator<<(poVar3,
                             "_read (ThriftStruct *object, ThriftProtocol *protocol, GError **error)"
                            );
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    local_24c = -1;
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"gint32 ret;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"gint32 xfer = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"gchar *name = NULL;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3,"ThriftType ftype;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"gint16 fid;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"guint32 len = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"gpointer data = NULL;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_158);
  poVar3 = std::operator<<(poVar3,(string *)this_get);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  for (pptVar4 = (local_1e8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (local_1e8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if ((*pptVar4)->req_ == T_REQUIRED) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"gboolean isset_");
      poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
      poVar3 = std::operator<<(poVar3," = FALSE;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"/* satisfy -Wall in case these aren\'t used */");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"THRIFT_UNUSED_VAR (len);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"THRIFT_UNUSED_VAR (data);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  if (this_get->_M_string_length != 0) {
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_248);
    poVar3 = std::operator<<(poVar3,"THRIFT_UNUSED_VAR (this_object);");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_248);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"/* read the struct begin marker */");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,
                           "if ((ret = thrift_protocol_read_struct_begin (protocol, &name, error)) < 0)"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"{");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3,"  if (name) g_free (name);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"  return ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24c);
  poVar3 = std::operator<<(poVar3,";");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"xfer += ret;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_158);
  poVar3 = std::operator<<(poVar3,"if (name) g_free (name);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"name = NULL;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"/* read the struct fields */");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"while (1)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"/* read the beginning of a field */");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,
                           "if ((ret = thrift_protocol_read_field_begin (protocol, &name, &ftype, &fid, error)) < 0)"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"{");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3,"  if (name) g_free (name);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"  return ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24c);
  poVar3 = std::operator<<(poVar3,";");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"xfer += ret;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_158);
  poVar3 = std::operator<<(poVar3,"if (name) g_free (name);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"name = NULL;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"/* break if we get a STOP field */");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"if (ftype == T_STOP)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"{");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3,"  break;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"switch (fid)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  for (pptVar4 = (local_1e8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (local_1e8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"case ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    this_00 = "if (ftype == ";
    poVar3 = std::operator<<(poVar3,"if (ftype == ");
    type_to_enum_abi_cxx11_(&local_248,(t_c_glib_generator *)this_00,(*pptVar4)->type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_248);
    poVar3 = std::operator<<(poVar3,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_248);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    tfield = *pptVar4;
    std::__cxx11::string::string((string *)&local_b0,(string *)local_138);
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_248);
    generate_deserialize_field(this,out,tfield,&local_b0,&local_50,local_24c,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_248);
    poVar3 = std::operator<<(poVar3,"} else {");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_228);
    poVar3 = std::operator<<(poVar3,
                             "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_208);
    poVar3 = std::operator<<(poVar3,"    return ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24c);
    poVar3 = std::operator<<(poVar3,";");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
    poVar3 = std::operator<<(poVar3,"  xfer += ret;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_198);
    poVar3 = std::operator<<(poVar3,"break;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"default:");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"    return ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24c);
  poVar3 = std::operator<<(poVar3,";");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3,"  xfer += ret;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"  break;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,
                           "if ((ret = thrift_protocol_read_field_end (protocol, error)) < 0)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"  return ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24c);
  poVar3 = std::operator<<(poVar3,";");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"xfer += ret;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,
                           "if ((ret = thrift_protocol_read_struct_end (protocol, error)) < 0)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"  return ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24c);
  poVar3 = std::operator<<(poVar3,";");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"xfer += ret;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  for (pptVar4 = (local_1e8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (local_1e8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if ((*pptVar4)->req_ == T_REQUIRED) {
      t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_248);
      poVar3 = std::operator<<(poVar3,"if (!isset_");
      poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
      poVar3 = std::operator<<(poVar3,")");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_228);
      poVar3 = std::operator<<(poVar3,"{");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_208);
      poVar3 = std::operator<<(poVar3,"  g_set_error (error, THRIFT_PROTOCOL_ERROR,");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
      poVar3 = std::operator<<(poVar3,"               THRIFT_PROTOCOL_ERROR_INVALID_DATA,");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
      poVar3 = std::operator<<(poVar3,"               \"missing field\");");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_198);
      poVar3 = std::operator<<(poVar3,"  return -1;");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_178);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
    }
  }
  if ((char)local_19c != '\0') {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"return xfer;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&name_uc);
  std::__cxx11::string::~string((string *)&name_u);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_c_glib_generator::generate_struct_reader(ostream& out,
                                                t_struct* tstruct,
                                                string this_name,
                                                string this_get,
                                                bool is_function) {
  string name = tstruct->get_name();
  string name_u = initial_caps_to_underscores(name);
  string name_uc = to_upper_case(name_u);
  int error_ret = 0;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (is_function) {
    error_ret = -1;
    indent(out) << "/* reads a " << name_u << " object */" << endl << "static gint32" << endl
                << this->nspace_lc << name_u
                << "_read (ThriftStruct *object, ThriftProtocol *protocol, GError **error)" << endl;
  }

  indent(out) << "{" << endl;
  indent_up();

  // declare stack temp variables
  out << indent() << "gint32 ret;" << endl << indent() << "gint32 xfer = 0;" << endl << indent()
      << "gchar *name = NULL;" << endl << indent() << "ThriftType ftype;" << endl << indent()
      << "gint16 fid;" << endl << indent() << "guint32 len = 0;" << endl << indent()
      << "gpointer data = NULL;" << endl << indent() << this_get << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      indent(out) << "gboolean isset_" << (*f_iter)->get_name() << " = FALSE;" << endl;
    }
  }

  out << endl;

  // satisfy -Wall in case we don't use some variables
  out << indent() << "/* satisfy -Wall in case these aren't used */" << endl << indent()
      << "THRIFT_UNUSED_VAR (len);" << endl << indent() << "THRIFT_UNUSED_VAR (data);" << endl;

  if (!this_get.empty()) {
    out << indent() << "THRIFT_UNUSED_VAR (this_object);" << endl;
  }
  out << endl;

  // read the beginning of the structure marker
  out << indent() << "/* read the struct begin marker */" << endl << indent()
      << "if ((ret = thrift_protocol_read_struct_begin (protocol, &name, error)) < 0)" << endl
      << indent() << "{" << endl << indent() << "  if (name) g_free (name);" << endl << indent()
      << "  return " << error_ret << ";" << endl << indent() << "}" << endl << indent()
      << "xfer += ret;" << endl << indent() << "if (name) g_free (name);" << endl << indent()
      << "name = NULL;" << endl << endl;

  // read the struct fields
  out << indent() << "/* read the struct fields */" << endl << indent() << "while (1)" << endl;
  scope_up(out);

  // read beginning field marker
  out << indent() << "/* read the beginning of a field */" << endl << indent()
      << "if ((ret = thrift_protocol_read_field_begin (protocol, &name, &ftype, &fid, error)) < 0)"
      << endl << indent() << "{" << endl << indent() << "  if (name) g_free (name);" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "}" << endl << indent()
      << "xfer += ret;" << endl << indent() << "if (name) g_free (name);" << endl << indent()
      << "name = NULL;" << endl << endl;

  // check for field STOP marker
  out << indent() << "/* break if we get a STOP field */" << endl << indent()
      << "if (ftype == T_STOP)" << endl << indent() << "{" << endl << indent() << "  break;" << endl
      << indent() << "}" << endl << endl;

  // switch depending on the field type
  indent(out) << "switch (fid)" << endl;

  // start switch
  scope_up(out);

  // generate deserialization code for known types
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if (ftype == " << type_to_enum((*f_iter)->get_type()) << ")" << endl;
    indent(out) << "{" << endl;

    indent_up();
    // generate deserialize field
    generate_deserialize_field(out, *f_iter, this_name, "", error_ret, false);
    indent_down();

    out << indent() << "} else {" << endl << indent()
        << "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)" << endl << indent()
        << "    return " << error_ret << ";" << endl << indent() << "  xfer += ret;" << endl
        << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  // create the default case
  out << indent() << "default:" << endl << indent()
      << "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)" << endl << indent()
      << "    return " << error_ret << ";" << endl << indent() << "  xfer += ret;" << endl
      << indent() << "  break;" << endl;

  // end switch
  scope_down(out);

  // read field end marker
  out << indent() << "if ((ret = thrift_protocol_read_field_end (protocol, error)) < 0)" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "xfer += ret;" << endl;

  // end while loop
  scope_down(out);
  out << endl;

  // read the end of the structure
  out << indent() << "if ((ret = thrift_protocol_read_struct_end (protocol, error)) < 0)" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "xfer += ret;" << endl
      << endl;

  // if a required field is missing, throw an error
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      out << indent() << "if (!isset_" << (*f_iter)->get_name() << ")" << endl << indent() << "{"
          << endl << indent() << "  g_set_error (error, THRIFT_PROTOCOL_ERROR," << endl << indent()
          << "               THRIFT_PROTOCOL_ERROR_INVALID_DATA," << endl << indent()
          << "               \"missing field\");" << endl << indent() << "  return -1;" << endl
          << indent() << "}" << endl << endl;
    }
  }

  if (is_function) {
    indent(out) << "return xfer;" << endl;
  }

  // end the function/structure
  indent_down();
  indent(out) << "}" << endl << endl;
}